

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O2

Format __thiscall
QRhiImplementation::shaderDescVariableFormatToVertexInputFormat
          (QRhiImplementation *this,VariableType type)

{
  Format FVar1;
  
  FVar1 = Float4;
  switch(type) {
  case Float:
    FVar1 = Float;
    break;
  case Vec2:
  case Int:
    return type;
  case Vec3:
    FVar1 = Float3;
  case Vec4:
    return FVar1;
  case Mat2:
  case Mat2x3:
  case Mat2x4:
  case Mat3:
  case Mat3x2:
  case Mat3x4:
  case Mat4:
  case Mat4x2:
  case Mat4x3:
    return *(Format *)(&DAT_005f23fc + (long)(int)type * 4);
  case Int2:
    FVar1 = SInt2;
    break;
  case Int3:
    FVar1 = SInt3;
    break;
  case Int4:
    FVar1 = SInt4;
    break;
  case Uint:
    FVar1 = UInt;
    break;
  case Uint2:
    FVar1 = UInt2;
    break;
  case Uint3:
    FVar1 = UInt3;
    break;
  case Uint4:
    FVar1 = UInt4;
    break;
  default:
    FVar1 = (*(code *)(&DAT_005f2208 + *(int *)(&DAT_005f2208 + (ulong)(type - Half) * 4)))();
    return FVar1;
  }
  return FVar1;
}

Assistant:

QRhiVertexInputAttribute::Format QRhiImplementation::shaderDescVariableFormatToVertexInputFormat(QShaderDescription::VariableType type) const
{
    switch (type) {
    case QShaderDescription::Vec4:
        return QRhiVertexInputAttribute::Float4;
    case QShaderDescription::Vec3:
        return QRhiVertexInputAttribute::Float3;
    case QShaderDescription::Vec2:
        return QRhiVertexInputAttribute::Float2;
    case QShaderDescription::Float:
        return QRhiVertexInputAttribute::Float;

    case QShaderDescription::Int4:
        return QRhiVertexInputAttribute::SInt4;
    case QShaderDescription::Int3:
        return QRhiVertexInputAttribute::SInt3;
    case QShaderDescription::Int2:
        return QRhiVertexInputAttribute::SInt2;
    case QShaderDescription::Int:
        return QRhiVertexInputAttribute::SInt;

    case QShaderDescription::Uint4:
        return QRhiVertexInputAttribute::UInt4;
    case QShaderDescription::Uint3:
        return QRhiVertexInputAttribute::UInt3;
    case QShaderDescription::Uint2:
        return QRhiVertexInputAttribute::UInt2;
    case QShaderDescription::Uint:
        return QRhiVertexInputAttribute::UInt;

    case QShaderDescription::Half4:
        return QRhiVertexInputAttribute::Half4;
    case QShaderDescription::Half3:
        return QRhiVertexInputAttribute::Half3;
    case QShaderDescription::Half2:
        return QRhiVertexInputAttribute::Half2;
    case QShaderDescription::Half:
        return QRhiVertexInputAttribute::Half;

    default:
        Q_UNREACHABLE_RETURN(QRhiVertexInputAttribute::Float);
    }
}